

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

string * __thiscall SqlGenerator::getFunctionString_abi_cxx11_(SqlGenerator *this,size_t fid)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  string fvars;
  Function *f;
  size_t in_stack_fffffffffffffc68;
  allocator *paVar3;
  QueryCompiler *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  TreeDecomposition *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  allocator local_32a;
  allocator local_329;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [36];
  undefined4 local_a4;
  string local_a0 [32];
  string local_80 [32];
  ulong local_60;
  undefined1 local_41 [33];
  Function *local_20;
  
  __lhs_00 = in_RDI;
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x314112);
  local_20 = QueryCompiler::getFunction(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  __lhs_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_41 + 1),"",(allocator *)__lhs_01);
  std::allocator<char>::~allocator((allocator<char> *)local_41);
  for (local_60 = 0; local_60 < 100; local_60 = local_60 + 1) {
    bVar1 = std::bitset<100UL>::test
                      ((bitset<100UL> *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    if (bVar1) {
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x3141b5);
      in_stack_fffffffffffffc80 =
           (TreeDecomposition *)
           TreeDecomposition::getAttribute(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      std::operator+(__lhs_00,(char *)in_RDI);
      std::__cxx11::string::operator+=((string *)(local_41 + 1),local_80);
      std::__cxx11::string::~string(local_80);
    }
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::pop_back();
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (ulong)local_20->_operation;
  switch(__lhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::__cxx11::to_string((unsigned_long)__lhs_01);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_a0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::__cxx11::string::string((string *)in_RDI,(string *)(local_41 + 1));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::__cxx11::string::string((string *)in_RDI,(string *)(local_41 + 1));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::operator+(__lhs_00,(char *)in_RDI);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_c8);
    break;
  default:
    std::__cxx11::to_string((unsigned_long)__lhs_01);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc70);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffcb0);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
    std::__cxx11::to_string((unsigned_long)__lhs_01);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_308);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    std::__cxx11::to_string((unsigned_long)__lhs_01);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_e8);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
    std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::to_string((double)__lhs);
    std::operator+(__lhs_01,in_RSI);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::to_string((double)__lhs);
    std::operator+(__lhs_01,in_RSI);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa:
    std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::to_string((double)__lhs);
    std::operator+(__lhs_01,in_RSI);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_248);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb:
    std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::to_string((double)__lhs);
    std::operator+(__lhs_01,in_RSI);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2e8);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_2c8);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc:
    std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffc70);
    std::__cxx11::string::~string(local_328);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd:
    paVar3 = &local_329;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"(0.15)",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_329);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe:
    paVar3 = &local_32a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"1",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_32a);
  }
  local_a4 = 1;
  std::__cxx11::string::~string((string *)(local_41 + 1));
  return __lhs_00;
}

Assistant:

inline string SqlGenerator::getFunctionString(size_t fid)
{
    Function* f = _qc->getFunction(fid);

    string fvars = "";
    for (size_t i = 0; i < NUM_OF_VARIABLES; ++i)
    {
        if (f->_fVars.test(i))
            fvars +=  _td->getAttribute(i)->_name + ",";
    }
    if (!fvars.empty())
        fvars.pop_back();

    switch (f->_operation)
    {
    case Operation::count :
        return "f_"+to_string(fid);
    case Operation::sum :
        return fvars;  
    case Operation::linear_sum :
        return fvars;
    case Operation::quadratic_sum :
        return fvars+"*"+fvars;
    case Operation::prod :
        return "f_"+to_string(fid);
    case Operation::indicator_eq :
        return "CASE WHEN "+fvars+" = "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_neq :
        return "CASE WHEN "+fvars+" != "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_lt :
        return "CASE WHEN "+fvars+" <= "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_gt :
        return "CASE WHEN "+fvars+" > "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::exponential :
        return "f_"+to_string(fid);
    // case Operation::lr_cont_parameter :
    //     return "("+fvars+"_param*"+fvars+")";
    // case Operation::lr_cat_parameter :
    //     return "("+fvars+"_param)";
    case Operation::lr_cont_parameter :
        return "(0.15*"+fvars+")";
    case Operation::lr_cat_parameter :
        return "(0.15)";
    case Operation::dynamic :
      return "1";
    default : return "f_"+to_string(fid);
    }

    return " ";
}